

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::
int_writer<int,_fmt::v6::basic_format_specs<wchar_t>_>::on_oct
          (int_writer<int,_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  uint uVar1;
  bin_writer<3> f;
  string_view prefix;
  int iVar2;
  char *in_RDI;
  string_view sVar3;
  size_t unaff_retaddr;
  format_specs in_stack_00000010;
  int num_digits;
  unsigned_type in_stack_fffffffffffffff0;
  char *pcVar4;
  
  pcVar4 = in_RDI;
  iVar2 = count_digits<3u,unsigned_int>(*(uint *)(in_RDI + 0x10));
  if (((*(char *)(*(long *)(in_RDI + 8) + 9) < '\0') &&
      (*(int *)(*(long *)(in_RDI + 8) + 4) <= iVar2)) && (*(int *)(in_RDI + 0x10) != 0)) {
    uVar1 = *(uint *)(in_RDI + 0x18);
    *(uint *)(in_RDI + 0x18) = uVar1 + 1;
    in_RDI[(ulong)uVar1 + 0x14] = '0';
  }
  sVar3 = get_prefix((int_writer<int,_fmt::v6::basic_format_specs<wchar_t>_> *)0x1c0b7b);
  prefix.size_ = unaff_retaddr;
  prefix.data_ = pcVar4;
  f.num_digits = iVar2;
  f.abs_value = in_stack_fffffffffffffff0;
  basic_writer<fmt::v6::buffer_range<wchar_t>>::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<int,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>
            ((basic_writer<fmt::v6::buffer_range<wchar_t>_> *)sVar3.size_,sVar3.data_._4_4_,prefix,
             in_stack_00000010,f);
  return;
}

Assistant:

void on_oct() {
      int num_digits = count_digits<3>(abs_value);
      if (specs.alt && specs.precision <= num_digits && abs_value != 0) {
        // Octal prefix '0' is counted as a digit, so only add it if precision
        // is not greater than the number of digits.
        prefix[prefix_size++] = '0';
      }
      writer.write_int(num_digits, get_prefix(), specs,
                       bin_writer<3>{abs_value, num_digits});
    }